

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

char * coda_XML_GetInputContext(XML_Parser parser,int *offset,int *size)

{
  char *pcVar1;
  
  if ((parser != (XML_Parser)0x0) && (parser->m_eventPtr != (char *)0x0)) {
    pcVar1 = parser->m_buffer;
    if (pcVar1 != (char *)0x0) {
      if (offset != (int *)0x0) {
        *offset = (int)parser->m_eventPtr - (int)pcVar1;
      }
      if (size != (int *)0x0) {
        *size = *(int *)&parser->m_bufferEnd - (int)pcVar1;
      }
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *XMLCALL
XML_GetInputContext(XML_Parser parser, int *offset, int *size) {
#if XML_CONTEXT_BYTES > 0
  if (parser == NULL)
    return NULL;
  if (parser->m_eventPtr && parser->m_buffer) {
    if (offset != NULL)
      *offset = (int)(parser->m_eventPtr - parser->m_buffer);
    if (size != NULL)
      *size = (int)(parser->m_bufferEnd - parser->m_buffer);
    return parser->m_buffer;
  }
#else
  (void)parser;
  (void)offset;
  (void)size;
#endif /* XML_CONTEXT_BYTES > 0 */
  return (const char *)0;
}